

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O2

string_t duckdb::SubstringSlice(Vector *result,char *input_data,int64_t offset,int64_t length)

{
  char *__dest;
  string_t result_string;
  anon_union_16_2_67f50693_for_value local_28;
  
  local_28.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)result,(Vector *)length,offset);
  __dest = local_28.pointer.prefix;
  if (0xc < local_28._0_4_) {
    __dest = local_28._8_8_;
  }
  switchD_016b0717::default(__dest,input_data + offset,length);
  string_t::Finalize((string_t *)&local_28.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28.pointer;
}

Assistant:

string_t SubstringSlice(Vector &result, const char *input_data, int64_t offset, int64_t length) {
	auto result_string = StringVector::EmptyString(result, UnsafeNumericCast<idx_t>(length));
	auto result_data = result_string.GetDataWriteable();
	memcpy(result_data, input_data + offset, UnsafeNumericCast<size_t>(length));
	result_string.Finalize();
	return result_string;
}